

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_boolean
          (xpath_ast_node *this,xpath_context *c,xpath_stack *stack)

{
  char cVar1;
  char_t cVar2;
  char_t cVar3;
  bool bVar4;
  xpath_value_type xVar5;
  char_t *pcVar6;
  unspecified_bool_type p_Var7;
  unspecified_bool_type p_Var8;
  char_t *pcVar9;
  double value_00;
  bool local_209;
  anon_union_8_5_7bd254c6_for__data local_208;
  bool local_1fd;
  bool local_1e2;
  bool local_1e1;
  xpath_node_set_raw local_1d0;
  undefined1 local_1b0 [8];
  xpath_allocator_capture cr_4;
  undefined1 local_178 [8];
  xpath_allocator_capture cr_3;
  xml_attribute local_150;
  xml_attribute attr;
  char_t *value_1;
  char *local_130;
  char_t *lit;
  char_t *value;
  xml_attribute a;
  xml_node n;
  xpath_string lang;
  xpath_allocator_capture cr_2;
  undefined1 local_d0 [8];
  xpath_string rr_1;
  xpath_string lr_1;
  xpath_allocator_capture cr_1;
  xpath_string rr;
  xpath_string lr;
  xpath_allocator_capture cr;
  xpath_stack *stack_local;
  xpath_context *c_local;
  xpath_ast_node *this_local;
  
  switch(this->_type) {
  case '\x01':
    bVar4 = eval_boolean(this->_left,c,stack);
    local_1e1 = true;
    if (!bVar4) {
      local_1e1 = eval_boolean(this->_right,c,stack);
    }
    this_local._7_1_ = local_1e1;
    break;
  case '\x02':
    bVar4 = eval_boolean(this->_left,c,stack);
    local_1e2 = false;
    if (bVar4) {
      local_1e2 = eval_boolean(this->_right,c,stack);
    }
    this_local._7_1_ = local_1e2;
    break;
  case '\x03':
    this_local._7_1_ =
         compare_eq<pugi::impl::(anonymous_namespace)::equal_to>
                   (this->_left,this->_right,c,stack,(equal_to *)((long)&cr._state._error + 7));
    break;
  case '\x04':
    this_local._7_1_ =
         compare_eq<pugi::impl::(anonymous_namespace)::not_equal_to>
                   (this->_left,this->_right,c,stack,(not_equal_to *)((long)&cr._state._error + 6));
    break;
  case '\x05':
    this_local._7_1_ =
         compare_rel<pugi::impl::(anonymous_namespace)::less>
                   (this->_left,this->_right,c,stack,(less *)((long)&cr._state._error + 5));
    break;
  case '\x06':
    this_local._7_1_ =
         compare_rel<pugi::impl::(anonymous_namespace)::less>
                   (this->_right,this->_left,c,stack,(less *)((long)&cr._state._error + 4));
    break;
  case '\a':
    this_local._7_1_ =
         compare_rel<pugi::impl::(anonymous_namespace)::less_equal>
                   (this->_left,this->_right,c,stack,(less_equal *)((long)&cr._state._error + 3));
    break;
  case '\b':
    this_local._7_1_ =
         compare_rel<pugi::impl::(anonymous_namespace)::less_equal>
                   (this->_right,this->_left,c,stack,(less_equal *)((long)&cr._state._error + 2));
    break;
  default:
    goto LAB_0054aa2f;
  case '\x14':
    cVar1 = this->_rettype;
    xVar5 = xpath_variable::type((this->_data).variable);
    if ((int)cVar1 != xVar5) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x2969,
                    "bool pugi::impl::(anonymous namespace)::xpath_ast_node::eval_boolean(const xpath_context &, const xpath_stack &)"
                   );
    }
    if (this->_rettype == '\x04') {
      bVar4 = xpath_variable::get_boolean((this->_data).variable);
      return bVar4;
    }
LAB_0054aa2f:
    cVar1 = this->_rettype;
    if (cVar1 == '\x01') {
      xpath_allocator_capture::xpath_allocator_capture
                ((xpath_allocator_capture *)local_1b0,stack->result);
      eval_node_set(&local_1d0,this,c,stack,nodeset_eval_any);
      bVar4 = xpath_node_set_raw::empty(&local_1d0);
      this_local._7_1_ = (bool)((bVar4 ^ 0xffU) & 1);
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_1b0);
    }
    else if (cVar1 == '\x02') {
      value_00 = eval_number(this,c,stack);
      this_local._7_1_ = convert_number_to_boolean(value_00);
    }
    else {
      if (cVar1 != '\x03') {
        __assert_fail("false && \"Wrong expression for return type boolean\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x298b,
                      "bool pugi::impl::(anonymous namespace)::xpath_ast_node::eval_boolean(const xpath_context &, const xpath_stack &)"
                     );
      }
      xpath_allocator_capture::xpath_allocator_capture
                ((xpath_allocator_capture *)local_178,stack->result);
      eval_string((xpath_string *)&cr_4._state._error,this,c,stack);
      bVar4 = xpath_string::empty((xpath_string *)&cr_4._state._error);
      this_local._7_1_ = (bool)((bVar4 ^ 0xffU) & 1);
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_178);
    }
    break;
  case '\"':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&lr._length_heap,stack->result);
    eval_string((xpath_string *)&rr._length_heap,this->_left,c,stack);
    eval_string((xpath_string *)&cr_1._state._error,this->_right,c,stack);
    pcVar9 = xpath_string::c_str((xpath_string *)&rr._length_heap);
    pcVar6 = xpath_string::c_str((xpath_string *)&cr_1._state._error);
    this_local._7_1_ = starts_with(pcVar9,pcVar6);
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&lr._length_heap);
    break;
  case '#':
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&lr_1._length_heap,stack->result);
    eval_string((xpath_string *)&rr_1._length_heap,this->_left,c,stack);
    eval_string((xpath_string *)local_d0,this->_right,c,stack);
    pcVar9 = xpath_string::c_str((xpath_string *)&rr_1._length_heap);
    pcVar6 = xpath_string::c_str((xpath_string *)local_d0);
    pcVar9 = find_substring(pcVar9,pcVar6);
    this_local._7_1_ = pcVar9 != (char_t *)0x0;
    xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&lr_1._length_heap)
    ;
    break;
  case '-':
    this_local._7_1_ = eval_boolean(this->_left,c,stack);
    break;
  case '.':
    bVar4 = eval_boolean(this->_left,c,stack);
    this_local._7_1_ = (bool)((bVar4 ^ 0xffU) & 1);
    break;
  case '/':
    this_local._7_1_ = true;
    break;
  case '0':
    this_local._7_1_ = false;
    break;
  case '1':
    cr_2._state._error = (bool *)xpath_node::attribute(&c->n);
    p_Var8 = xml_attribute::operator_cast_to_function_pointer((xml_attribute *)&cr_2._state._error);
    if (p_Var8 != (unspecified_bool_type)0x0) {
      return false;
    }
    xpath_allocator_capture::xpath_allocator_capture
              ((xpath_allocator_capture *)&lang._length_heap,stack->result);
    eval_string((xpath_string *)&n,this->_left,c,stack);
    a._attr = (xml_attribute_struct *)xpath_node::node(&c->n);
    while (p_Var7 = xml_node::operator_cast_to_function_pointer((xml_node *)&a),
          p_Var7 != (unspecified_bool_type)0x0) {
      value = (char_t *)xml_node::attribute((xml_node *)&a,"xml:lang");
      p_Var8 = xml_attribute::operator_cast_to_function_pointer((xml_attribute *)&value);
      if (p_Var8 != (unspecified_bool_type)0x0) {
        lit = xml_attribute::value((xml_attribute *)&value);
        local_130 = xpath_string::c_str((xpath_string *)&n);
        goto LAB_0054a7b8;
      }
      a._attr = (xml_attribute_struct *)xml_node::parent((xml_node *)&a);
    }
    this_local._7_1_ = false;
    goto LAB_0054a8ad;
  case ';':
    if (this->_right->_type == '\x12') {
      local_208 = this->_right->_data;
    }
    else {
      local_208.string = xpath_variable::get_string((this->_right->_data).variable);
    }
    attr._attr = (xml_attribute_struct *)local_208;
    cr_3._state._error = (bool *)xpath_node::node(&c->n);
    local_150 = xml_node::attribute((xml_node *)&cr_3._state._error,(this->_left->_data).string);
    p_Var8 = xml_attribute::operator_cast_to_function_pointer(&local_150);
    local_209 = false;
    if (p_Var8 != (unspecified_bool_type)0x0) {
      pcVar9 = xml_attribute::value(&local_150);
      bVar4 = strequal(pcVar9,(char_t *)attr._attr);
      local_209 = false;
      if (bVar4) {
        pcVar9 = xml_attribute::name(&local_150);
        local_209 = is_xpath_attribute(pcVar9);
      }
    }
    this_local._7_1_ = local_209;
  }
  return this_local._7_1_;
LAB_0054a7b8:
  if (*local_130 == '\0') goto LAB_0054a833;
  cVar2 = tolower_ascii(*local_130);
  cVar3 = tolower_ascii(*lit);
  if (cVar2 != cVar3) {
    this_local._7_1_ = false;
    goto LAB_0054a8ad;
  }
  lit = lit + 1;
  local_130 = local_130 + 1;
  goto LAB_0054a7b8;
LAB_0054a833:
  local_1fd = true;
  if (*lit != '\0') {
    local_1fd = *lit == '-';
  }
  this_local._7_1_ = local_1fd;
LAB_0054a8ad:
  xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&lang._length_heap);
  return this_local._7_1_;
}

Assistant:

bool eval_boolean(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_op_or:
				return _left->eval_boolean(c, stack) || _right->eval_boolean(c, stack);

			case ast_op_and:
				return _left->eval_boolean(c, stack) && _right->eval_boolean(c, stack);

			case ast_op_equal:
				return compare_eq(_left, _right, c, stack, equal_to());

			case ast_op_not_equal:
				return compare_eq(_left, _right, c, stack, not_equal_to());

			case ast_op_less:
				return compare_rel(_left, _right, c, stack, less());

			case ast_op_greater:
				return compare_rel(_right, _left, c, stack, less());

			case ast_op_less_or_equal:
				return compare_rel(_left, _right, c, stack, less_equal());

			case ast_op_greater_or_equal:
				return compare_rel(_right, _left, c, stack, less_equal());

			case ast_func_starts_with:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return starts_with(lr.c_str(), rr.c_str());
			}

			case ast_func_contains:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_string lr = _left->eval_string(c, stack);
				xpath_string rr = _right->eval_string(c, stack);

				return find_substring(lr.c_str(), rr.c_str()) != 0;
			}

			case ast_func_boolean:
				return _left->eval_boolean(c, stack);

			case ast_func_not:
				return !_left->eval_boolean(c, stack);

			case ast_func_true:
				return true;

			case ast_func_false:
				return false;

			case ast_func_lang:
			{
				if (c.n.attribute()) return false;

				xpath_allocator_capture cr(stack.result);

				xpath_string lang = _left->eval_string(c, stack);

				for (xml_node n = c.n.node(); n; n = n.parent())
				{
					xml_attribute a = n.attribute(PUGIXML_TEXT("xml:lang"));

					if (a)
					{
						const char_t* value = a.value();

						// strnicmp / strncasecmp is not portable
						for (const char_t* lit = lang.c_str(); *lit; ++lit)
						{
							if (tolower_ascii(*lit) != tolower_ascii(*value)) return false;
							++value;
						}

						return *value == 0 || *value == '-';
					}
				}

				return false;
			}

			case ast_opt_compare_attribute:
			{
				const char_t* value = (_right->_type == ast_string_constant) ? _right->_data.string : _right->_data.variable->get_string();

				xml_attribute attr = c.n.node().attribute(_left->_data.nodetest);

				return attr && strequal(attr.value(), value) && is_xpath_attribute(attr.name());
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_boolean)
					return _data.variable->get_boolean();

				// variable needs to be converted to the correct type, this is handled by the fallthrough block below
				break;
			}

			default:
				;
			}

			// none of the ast types that return the value directly matched, we need to perform type conversion
			switch (_rettype)
			{
			case xpath_type_number:
				return convert_number_to_boolean(eval_number(c, stack));

			case xpath_type_string:
			{
				xpath_allocator_capture cr(stack.result);

				return !eval_string(c, stack).empty();
			}

			case xpath_type_node_set:
			{
				xpath_allocator_capture cr(stack.result);

				return !eval_node_set(c, stack, nodeset_eval_any).empty();
			}

			default:
				assert(false && "Wrong expression for return type boolean"); // unreachable
				return false;
			}
		}